

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_avx512vnni.cpp
# Opt level: O0

void ncnn::transpose_pack_A_tile_int8_avx512vnni(Mat *A,Mat *AT,int i,int max_ii,int k,int max_kk)

{
  int in_stack_00000318;
  int in_stack_0000031c;
  int in_stack_00000320;
  int in_stack_00000324;
  Mat *in_stack_00000328;
  Mat *in_stack_00000330;
  
  transpose_pack_A_tile_int8
            (in_stack_00000330,in_stack_00000328,in_stack_00000324,in_stack_00000320,
             in_stack_0000031c,in_stack_00000318);
  return;
}

Assistant:

void transpose_pack_A_tile_int8_avx512vnni(const Mat& A, Mat& AT, int i, int max_ii, int k, int max_kk)
{
    transpose_pack_A_tile_int8(A, AT, i, max_ii, k, max_kk);
}